

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

void __thiscall vkb::SystemInfo::SystemInfo(SystemInfo *this)

{
  pointer pVVar1;
  undefined *__s2;
  VkResult VVar2;
  int iVar3;
  pointer pVVar4;
  pointer pVVar5;
  VkExtensionProperties *ext_1;
  pointer pVVar6;
  pointer pVVar7;
  VkLayerProperties *layer;
  pointer pVVar8;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> layer_extensions;
  
  (this->available_extensions).
  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->available_extensions).
  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->available_layers).super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->available_extensions).
  super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->available_layers).super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->available_layers).super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->validation_layers_available = false;
  this->debug_utils_available = false;
  this->instance_api_version = 0x400000;
  VVar2 = detail::get_vector<VkLayerProperties,VkResult(*&)(unsigned_int*,VkLayerProperties*)>
                    (&this->available_layers,
                     (_func_VkResult_uint_ptr_VkLayerProperties_ptr **)
                     (detail::vulkan_functions()::v + 0x48));
  pVVar5 = (this->available_layers).
           super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar1 = (this->available_layers).
           super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pVVar4 = pVVar1;
  if ((VVar2 != VK_SUCCESS) && (pVVar4 = pVVar5, pVVar1 != pVVar5)) {
    (this->available_layers).
    super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar5;
  }
  __s2 = detail::validation_layer_name;
  for (; pVVar5 != pVVar4; pVVar5 = pVVar5 + 1) {
    iVar3 = strcmp(pVVar5->layerName,__s2);
    if (iVar3 == 0) {
      this->validation_layers_available = true;
    }
  }
  layer_extensions.super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  VVar2 = detail::
          get_vector<VkExtensionProperties,VkResult(*&)(char_const*,unsigned_int*,VkExtensionProperties*),decltype(nullptr)>
                    (&this->available_extensions,
                     (_func_VkResult_char_ptr_uint_ptr_VkExtensionProperties_ptr **)
                     (detail::vulkan_functions()::v + 0x40),(void **)&layer_extensions);
  pVVar8 = (this->available_extensions).
           super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl
           .super__Vector_impl_data._M_start;
  pVVar7 = (this->available_extensions).
           super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl
           .super__Vector_impl_data._M_finish;
  pVVar6 = pVVar7;
  if ((VVar2 != VK_SUCCESS) && (pVVar6 = pVVar8, pVVar7 != pVVar8)) {
    (this->available_extensions).
    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar8;
  }
  for (; pVVar8 != pVVar6; pVVar8 = pVVar8 + 1) {
    iVar3 = bcmp(pVVar8,"VK_EXT_debug_utils",0x13);
    if (iVar3 == 0) {
      this->debug_utils_available = true;
    }
  }
  pVVar1 = (this->available_layers).
           super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pVVar5 = (this->available_layers).
                super__Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>._M_impl.
                super__Vector_impl_data._M_start; pVVar5 != pVVar1; pVVar5 = pVVar5 + 1) {
    layer_extensions.
    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    layer_extensions.
    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    layer_extensions.
    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    VVar2 = detail::
            get_vector<VkExtensionProperties,VkResult(*&)(char_const*,unsigned_int*,VkExtensionProperties*),char(&)[256]>
                      ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                       &layer_extensions.
                        super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                       ,(_func_VkResult_char_ptr_uint_ptr_VkExtensionProperties_ptr **)
                        (detail::vulkan_functions()::v + 0x40),pVVar5->layerName);
    if (VVar2 == VK_SUCCESS) {
      std::vector<VkExtensionProperties,std::allocator<VkExtensionProperties>>::
      insert<__gnu_cxx::__normal_iterator<VkExtensionProperties*,std::vector<VkExtensionProperties,std::allocator<VkExtensionProperties>>>,void>
                ((vector<VkExtensionProperties,std::allocator<VkExtensionProperties>> *)
                 &this->available_extensions,
                 (this->available_extensions).
                 super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
                  )layer_extensions.
                   super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
                  )layer_extensions.
                   super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      pVVar8 = layer_extensions.
               super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pVVar7 = layer_extensions.
                    super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start; pVVar7 != pVVar8; pVVar7 = pVVar7 + 1
          ) {
        iVar3 = bcmp(pVVar7,"VK_EXT_debug_utils",0x13);
        if (iVar3 == 0) {
          this->debug_utils_available = true;
        }
      }
    }
    std::_Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::~_Vector_base
              (&layer_extensions.
                super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>);
  }
  if ((detail::vulkan_functions()::v._80_8_ != 0) &&
     (iVar3 = (*(code *)detail::vulkan_functions()::v._80_8_)(&this->instance_api_version),
     iVar3 != 0)) {
    this->instance_api_version = 0x400000;
  }
  return;
}

Assistant:

SystemInfo::SystemInfo() {
    auto available_layers_ret = detail::get_vector<VkLayerProperties>(
        this->available_layers, detail::vulkan_functions().fp_vkEnumerateInstanceLayerProperties);
    if (available_layers_ret != VK_SUCCESS) {
        this->available_layers.clear();
    }

    for (auto& layer : this->available_layers)
        if (strcmp(layer.layerName, detail::validation_layer_name) == 0) validation_layers_available = true;

    auto available_extensions_ret = detail::get_vector<VkExtensionProperties>(
        this->available_extensions, detail::vulkan_functions().fp_vkEnumerateInstanceExtensionProperties, nullptr);
    if (available_extensions_ret != VK_SUCCESS) {
        this->available_extensions.clear();
    }

    for (auto& ext : this->available_extensions) {
        if (strcmp(ext.extensionName, VK_EXT_DEBUG_UTILS_EXTENSION_NAME) == 0) {
            debug_utils_available = true;
        }
    }

    for (auto& layer : this->available_layers) {
        std::vector<VkExtensionProperties> layer_extensions;
        auto layer_extensions_ret = detail::get_vector<VkExtensionProperties>(
            layer_extensions, detail::vulkan_functions().fp_vkEnumerateInstanceExtensionProperties, layer.layerName);
        if (layer_extensions_ret == VK_SUCCESS) {
            this->available_extensions.insert(
                this->available_extensions.end(), layer_extensions.begin(), layer_extensions.end());
            for (auto& ext : layer_extensions) {
                if (strcmp(ext.extensionName, VK_EXT_DEBUG_UTILS_EXTENSION_NAME) == 0) {
                    debug_utils_available = true;
                }
            }
        }
    }

    PFN_vkEnumerateInstanceVersion pfn_vkEnumerateInstanceVersion = detail::vulkan_functions().fp_vkEnumerateInstanceVersion;

    if (pfn_vkEnumerateInstanceVersion != nullptr) {
        VkResult res = pfn_vkEnumerateInstanceVersion(&instance_api_version);
        if (res != VK_SUCCESS) {
            instance_api_version = VKB_VK_API_VERSION_1_0;
        }
    }
}